

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::Execute(DrawTiltedSpanPalCommand *this,DrawerThread *thread)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint8_t *puVar5;
  byte bVar6;
  byte bVar7;
  float fVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  float fVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  
  bVar10 = DrawerThread::line_skipped_by_thread
                     (thread,*(int *)&(this->super_DrawerCommand).field_0xc);
  if (!bVar10) {
    iVar14 = *(int *)&(this->super_DrawerCommand).field_0xc;
    iVar15 = this->x1;
    fVar21 = (float)(centery - iVar14);
    fVar26 = (float)(iVar15 - centerx);
    uVar13 = this->x2 - iVar15;
    fVar1 = (this->plane_sz).X;
    dVar29 = (double)(fVar1 * fVar26 + (this->plane_sz).Y * fVar21 + (this->plane_sz).Z);
    if (this->plane_shade == false) {
      uVar12 = 0;
      uVar16 = 0;
      if (0 < (int)uVar13) {
        uVar16 = (ulong)uVar13;
      }
      for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        thread->tiltlighting[uVar12] = this->_colormap;
      }
    }
    else {
      CalcTiltedLighting(this,(double)this->planelightfloat * dVar29,
                         ((double)(fVar1 * (float)(int)uVar13) + dVar29) *
                         (double)this->planelightfloat,uVar13,thread);
      iVar14 = *(int *)&(this->super_DrawerCommand).field_0xc;
      fVar21 = (float)(centery - iVar14);
      iVar15 = this->x1;
      fVar1 = (this->plane_sz).X;
      fVar26 = (float)(iVar15 - centerx);
    }
    fVar8 = (this->plane_su).X;
    lVar17 = (long)iVar15 + (long)(int)(&ylookup)[iVar14];
    puVar5 = this->_destorg;
    bVar9 = (byte)this->_ybits;
    bVar6 = 0x20 - bVar9;
    bVar11 = (byte)this->_xbits;
    bVar7 = bVar6 - bVar11;
    uVar18 = ~(-1 << (bVar11 & 0x1f)) << (bVar9 & 0x1f);
    fVar2 = (this->plane_sv).X;
    dVar22 = (double)(fVar26 * fVar8 + (this->plane_su).Z + fVar21 * (this->plane_su).Y);
    dVar23 = (double)(fVar26 * fVar2 + (this->plane_sv).Z + fVar21 * (this->plane_sv).Y);
    this->x1 = 0;
    iVar15 = 0;
    dVar24 = (1.0 / dVar29) * dVar22;
    dVar25 = (1.0 / dVar29) * dVar23;
    for (iVar14 = uVar13 + 1; 0xf < iVar14; iVar14 = iVar14 + -0x10) {
      dVar29 = dVar29 + (double)(fVar1 * 16.0);
      dVar22 = dVar22 + (double)(fVar8 * 16.0);
      dVar23 = dVar23 + (double)(fVar2 * 16.0);
      dVar27 = (1.0 / dVar29) * dVar22;
      dVar28 = (1.0 / dVar29) * dVar23;
      uVar13 = (int)(long)dVar24 + this->pviewx;
      uVar19 = (int)(long)dVar25 + this->pviewy;
      for (iVar20 = 0xf; -1 < iVar20; iVar20 = iVar20 + -1) {
        puVar5[iVar15 + lVar17] =
             thread->tiltlighting[iVar15]
             [this->_source[uVar13 >> (bVar7 & 0x1f) & uVar18 | uVar19 >> (bVar6 & 0x1f)]];
        iVar15 = this->x1 + 1;
        this->x1 = iVar15;
        uVar13 = uVar13 + (int)(long)((dVar27 - dVar24) * 0.0625);
        uVar19 = uVar19 + (int)(long)((dVar28 - dVar25) * 0.0625);
      }
      dVar24 = dVar27;
      dVar25 = dVar28;
    }
    if (0 < iVar14) {
      if (iVar14 == 1) {
        puVar5[iVar15 + lVar17] =
             thread->tiltlighting[iVar15]
             [this->_source
              [(uint)(long)dVar24 >> (bVar7 & 0x1f) & uVar18 | (uint)(long)dVar25 >> (bVar6 & 0x1f)]
             ];
      }
      else {
        dVar27 = (double)iVar14;
        fVar21 = (this->plane_su).X;
        dVar29 = 1.0 / ((double)(this->plane_sz).X * dVar27 + dVar29);
        fVar1 = (this->plane_sv).X;
        uVar3 = this->pviewx;
        uVar4 = this->pviewy;
        uVar13 = (int)(long)dVar24 + uVar3;
        uVar19 = (int)(long)dVar25 + uVar4;
        iVar20 = 0;
        while( true ) {
          if (iVar14 == iVar20) break;
          puVar5[iVar15 + lVar17] =
               thread->tiltlighting[iVar15]
               [this->_source[uVar13 >> (bVar7 & 0x1f) & uVar18 | uVar19 >> (bVar6 & 0x1f)]];
          iVar15 = this->x1 + 1;
          this->x1 = iVar15;
          uVar13 = uVar13 + (int)(long)((1.0 / dVar27) *
                                       (dVar29 * (dVar27 * (double)fVar21 + dVar22) - dVar24));
          uVar19 = uVar19 + (int)(long)((1.0 / dVar27) *
                                       (dVar29 * (dVar27 * (double)fVar1 + dVar23) - dVar25));
          iVar20 = iVar20 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void DrawTiltedSpanPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(y))
			return;

		const uint8_t **tiltlighting = thread->tiltlighting;

		int width = x2 - x1;
		double iz, uz, vz;
		uint8_t *fb;
		uint32_t u, v;
		int i;

		iz = plane_sz[2] + plane_sz[1] * (centery - y) + plane_sz[0] * (x1 - centerx);

		// Lighting is simple. It's just linear interpolation from start to end
		if (plane_shade)
		{
			uz = (iz + plane_sz[0] * width) * planelightfloat;
			vz = iz * planelightfloat;
			CalcTiltedLighting(vz, uz, width, thread);
		}
		else
		{
			for (int i = 0; i < width; ++i)
			{
				tiltlighting[i] = _colormap;
			}
		}

		uz = plane_su[2] + plane_su[1] * (centery - y) + plane_su[0] * (x1 - centerx);
		vz = plane_sv[2] + plane_sv[1] * (centery - y) + plane_sv[0] * (x1 - centerx);

		fb = ylookup[y] + x1 + _destorg;

		uint8_t vshift = 32 - _ybits;
		uint8_t ushift = vshift - _xbits;
		int umask = ((1 << _xbits) - 1) << _ybits;

		#if 0
		// The "perfect" reference version of this routine. Pretty slow.
		// Use it only to see how things are supposed to look.
		i = 0;
		do
		{
			double z = 1.f / iz;

			u = int64_t(uz*z) + pviewx;
			v = int64_t(vz*z) + pviewy;
			R_SetDSColorMapLight(tiltlighting[i], 0, 0);
			fb[i++] = ds_colormap[ds_source[(v >> vshift) | ((u >> ushift) & umask)]];
			iz += plane_sz[0];
			uz += plane_su[0];
			vz += plane_sv[0];
		} while (--width >= 0);
		#else
		//#define SPANSIZE 32
		//#define INVSPAN 0.03125f
		//#define SPANSIZE 8
		//#define INVSPAN 0.125f
		#define SPANSIZE 16
		#define INVSPAN	0.0625f

		double startz = 1.f / iz;
		double startu = uz*startz;
		double startv = vz*startz;
		double izstep, uzstep, vzstep;

		izstep = plane_sz[0] * SPANSIZE;
		uzstep = plane_su[0] * SPANSIZE;
		vzstep = plane_sv[0] * SPANSIZE;
		x1 = 0;
		width++;

		while (width >= SPANSIZE)
		{
			iz += izstep;
			uz += uzstep;
			vz += vzstep;

			double endz = 1.f / iz;
			double endu = uz*endz;
			double endv = vz*endz;
			uint32_t stepu = (uint32_t)int64_t((endu - startu) * INVSPAN);
			uint32_t stepv = (uint32_t)int64_t((endv - startv) * INVSPAN);
			u = (uint32_t)(int64_t(startu) + pviewx);
			v = (uint32_t)(int64_t(startv) + pviewy);

			for (i = SPANSIZE - 1; i >= 0; i--)
			{
				fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
				x1++;
				u += stepu;
				v += stepv;
			}
			startu = endu;
			startv = endv;
			width -= SPANSIZE;
		}
		if (width > 0)
		{
			if (width == 1)
			{
				u = (uint32_t)int64_t(startu);
				v = (uint32_t)int64_t(startv);
				fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
			}
			else
			{
				double left = width;
				iz += plane_sz[0] * left;
				uz += plane_su[0] * left;
				vz += plane_sv[0] * left;

				double endz = 1.f / iz;
				double endu = uz*endz;
				double endv = vz*endz;
				left = 1.f / left;
				uint32_t stepu = (uint32_t)int64_t((endu - startu) * left);
				uint32_t stepv = (uint32_t)int64_t((endv - startv) * left);
				u = (uint32_t)(int64_t(startu) + pviewx);
				v = (uint32_t)(int64_t(startv) + pviewy);

				for (; width != 0; width--)
				{
					fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
					x1++;
					u += stepu;
					v += stepv;
				}
			}
		}
		#endif
	}